

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall google::protobuf::Reflection::Swap(Reflection *this,Message *lhs,Message *rhs)

{
  bool bVar1;
  Reflection **ppRVar2;
  Reflection **ppRVar3;
  char *pcVar4;
  LogMessage *pLVar5;
  Descriptor *pDVar6;
  Message *this_00;
  string_view sVar7;
  Message *temp;
  Arena *arena;
  LogMessage local_c0;
  Voidify local_a9;
  Reflection *local_a8;
  Reflection *local_a0;
  Nullable<const_char_*> local_98;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  char *local_88;
  string_view local_80;
  LogMessage local_60;
  Voidify local_49;
  Reflection *local_48;
  Reflection *local_40;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *rhs_arena;
  Arena *lhs_arena;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  if (lhs != rhs) {
    lhs_arena = (Arena *)rhs;
    rhs_local = lhs;
    lhs_local = (Message *)this;
    rhs_arena = MessageLite::GetArena(&lhs->super_MessageLite);
    absl_log_internal_check_op_result =
         (Nullable<const_char_*>)MessageLite::GetArena((MessageLite *)lhs_arena);
    local_40 = Message::GetReflection(rhs_local);
    ppRVar2 = absl::lts_20250127::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_40);
    local_48 = this;
    ppRVar3 = absl::lts_20250127::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_48);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                         (ppRVar2,ppRVar3,"lhs->GetReflection() == this");
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x459,pcVar4);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [36])"First argument to Swap() (of type \"");
      pDVar6 = Message::GetDescriptor(rhs_local);
      local_80 = Descriptor::full_name(pDVar6);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,local_80);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [70])
                                 "\") is not compatible with this reflection object (which is for type \""
                         );
      sVar7 = Descriptor::full_name(this->descriptor_);
      local_88 = sVar7._M_str;
      absl_log_internal_check_op_result_1 = (Nullable<const_char_*>)sVar7._M_len;
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,sVar7);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [79])
                                 "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    local_a0 = Message::GetReflection((Message *)lhs_arena);
    ppRVar2 = absl::lts_20250127::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_a0);
    local_a8 = this;
    ppRVar3 = absl::lts_20250127::log_internal::
              GetReferenceableValue<google::protobuf::Reflection_const*>(&local_a8);
    local_98 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                         (ppRVar2,ppRVar3,"rhs->GetReflection() == this");
    if (local_98 != (Nullable<const_char_*>)0x0) {
      pcVar4 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x461,pcVar4);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [37])"Second argument to Swap() (of type \"");
      pDVar6 = Message::GetDescriptor((Message *)lhs_arena);
      sVar7 = Descriptor::full_name(pDVar6);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,sVar7);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [70])
                                 "\") is not compatible with this reflection object (which is for type \""
                         );
      sVar7 = Descriptor::full_name(this->descriptor_);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,sVar7);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [79])
                                 "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_c0);
    }
    bVar1 = internal::CanUseInternalSwap(rhs_arena,(Arena *)absl_log_internal_check_op_result);
    if (bVar1) {
      UnsafeArenaSwap(this,rhs_local,(Message *)lhs_arena);
    }
    else {
      temp = (Message *)rhs_arena;
      if (rhs_arena == (Arena *)0x0) {
        temp = (Message *)absl_log_internal_check_op_result;
        std::swap<google::protobuf::Message*>(&rhs_local,(Message **)&lhs_arena);
      }
      this_00 = Message::New(rhs_local,(Arena *)temp);
      Message::MergeFrom(this_00,(Message *)lhs_arena);
      Message::CopyFrom((Message *)lhs_arena,rhs_local);
      Swap(this,rhs_local,this_00);
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();

  // TODO:  Other Reflection methods should probably check this too.
  ABSL_CHECK_EQ(lhs->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << lhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  ABSL_CHECK_EQ(rhs->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << rhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (!internal::CanUseInternalSwap(lhs_arena, rhs_arena)) {
    // One of the two is guaranteed to have an arena.  Switch things around
    // to guarantee that lhs has an arena.
    Arena* arena = lhs_arena;
    if (arena == nullptr) {
      arena = rhs_arena;
      std::swap(lhs, rhs);  // Swapping names for pointers!
    }

    Message* temp = lhs->New(arena);
    temp->MergeFrom(*rhs);
    rhs->CopyFrom(*lhs);
    if (internal::DebugHardenForceCopyInSwap()) {
      lhs->CopyFrom(*temp);
      if (arena == nullptr) delete temp;
    } else {
      Swap(lhs, temp);
    }
    return;
  }

  UnsafeArenaSwap(lhs, rhs);
}